

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O0

void arith_encode(j_compress_ptr cinfo,uchar *st,int val)

{
  byte bVar1;
  long lVar2;
  uint val_00;
  int iVar3;
  long lVar4;
  long lVar5;
  int in_EDX;
  byte *in_RSI;
  long in_RDI;
  int sv;
  INT32 temp;
  INT32 qe;
  uchar nm;
  uchar nl;
  arith_entropy_ptr e;
  j_compress_ptr in_stack_ffffffffffffffb8;
  
  lVar2 = *(long *)(in_RDI + 0x230);
  bVar1 = *in_RSI;
  val_00 = (uint)bVar1;
  lVar5 = jpeg_aritab[(int)(val_00 & 0x7f)];
  lVar4 = lVar5 >> 0x10;
  *(long *)(lVar2 + 0x20) = *(long *)(lVar2 + 0x20) - lVar4;
  if (in_EDX == (int)val_00 >> 7) {
    if (0x7fff < *(long *)(lVar2 + 0x20)) {
      return;
    }
    if (*(long *)(lVar2 + 0x20) < lVar4) {
      *(long *)(lVar2 + 0x18) = *(long *)(lVar2 + 0x20) + *(long *)(lVar2 + 0x18);
      *(long *)(lVar2 + 0x20) = lVar4;
    }
    *in_RSI = bVar1 & 0x80 ^ (byte)((ulong)lVar5 >> 8);
  }
  else {
    if (lVar4 <= *(long *)(lVar2 + 0x20)) {
      *(long *)(lVar2 + 0x18) = *(long *)(lVar2 + 0x20) + *(long *)(lVar2 + 0x18);
      *(long *)(lVar2 + 0x20) = lVar4;
    }
    *in_RSI = bVar1 & 0x80 ^ (byte)lVar5;
  }
  do {
    *(long *)(lVar2 + 0x20) = *(long *)(lVar2 + 0x20) << 1;
    *(long *)(lVar2 + 0x18) = *(long *)(lVar2 + 0x18) << 1;
    iVar3 = *(int *)(lVar2 + 0x38) + -1;
    *(int *)(lVar2 + 0x38) = iVar3;
    if (iVar3 == 0) {
      lVar5 = *(long *)(lVar2 + 0x18) >> 0x13;
      if (lVar5 < 0x100) {
        if (lVar5 == 0xff) {
          *(long *)(lVar2 + 0x28) = *(long *)(lVar2 + 0x28) + 1;
        }
        else {
          if (*(int *)(lVar2 + 0x3c) == 0) {
            *(long *)(lVar2 + 0x30) = *(long *)(lVar2 + 0x30) + 1;
          }
          else if (-1 < *(int *)(lVar2 + 0x3c)) {
            lVar4 = *(long *)(lVar2 + 0x30);
            while (lVar4 != 0) {
              emit_byte(val_00,in_stack_ffffffffffffffb8);
              lVar4 = *(long *)(lVar2 + 0x30) + -1;
              *(long *)(lVar2 + 0x30) = lVar4;
            }
            emit_byte(val_00,in_stack_ffffffffffffffb8);
          }
          if (*(long *)(lVar2 + 0x28) != 0) {
            lVar4 = *(long *)(lVar2 + 0x30);
            while (lVar4 != 0) {
              emit_byte(val_00,in_stack_ffffffffffffffb8);
              lVar4 = *(long *)(lVar2 + 0x30) + -1;
              *(long *)(lVar2 + 0x30) = lVar4;
            }
            do {
              emit_byte(val_00,in_stack_ffffffffffffffb8);
              emit_byte(val_00,in_stack_ffffffffffffffb8);
              lVar4 = *(long *)(lVar2 + 0x28) + -1;
              *(long *)(lVar2 + 0x28) = lVar4;
            } while (lVar4 != 0);
          }
          *(uint *)(lVar2 + 0x3c) = (uint)lVar5 & 0xff;
        }
      }
      else {
        if (-1 < *(int *)(lVar2 + 0x3c)) {
          lVar4 = *(long *)(lVar2 + 0x30);
          while (lVar4 != 0) {
            emit_byte(val_00,in_stack_ffffffffffffffb8);
            lVar4 = *(long *)(lVar2 + 0x30) + -1;
            *(long *)(lVar2 + 0x30) = lVar4;
          }
          emit_byte(val_00,in_stack_ffffffffffffffb8);
          if (*(int *)(lVar2 + 0x3c) == 0xfe) {
            emit_byte(val_00,in_stack_ffffffffffffffb8);
          }
        }
        *(long *)(lVar2 + 0x30) = *(long *)(lVar2 + 0x28) + *(long *)(lVar2 + 0x30);
        *(undefined8 *)(lVar2 + 0x28) = 0;
        *(uint *)(lVar2 + 0x3c) = (uint)lVar5 & 0xff;
      }
      *(ulong *)(lVar2 + 0x18) = *(ulong *)(lVar2 + 0x18) & 0x7ffff;
      *(int *)(lVar2 + 0x38) = *(int *)(lVar2 + 0x38) + 8;
    }
  } while (*(long *)(lVar2 + 0x20) < 0x8000);
  return;
}

Assistant:

LOCAL(void)
arith_encode (j_compress_ptr cinfo, unsigned char *st, int val) 
{
  register arith_entropy_ptr e = (arith_entropy_ptr) cinfo->entropy;
  register unsigned char nl, nm;
  register INT32 qe, temp;
  register int sv;

  /* Fetch values from our compact representation of Table D.3(D.2):
   * Qe values and probability estimation state machine
   */
  sv = *st;
  qe = jpeg_aritab[sv & 0x7F];	/* => Qe_Value */
  nl = qe & 0xFF; qe >>= 8;	/* Next_Index_LPS + Switch_MPS */
  nm = qe & 0xFF; qe >>= 8;	/* Next_Index_MPS */

  /* Encode & estimation procedures per sections D.1.4 & D.1.5 */
  e->a -= qe;
  if (val != (sv >> 7)) {
    /* Encode the less probable symbol */
    if (e->a >= qe) {
      /* If the interval size (qe) for the less probable symbol (LPS)
       * is larger than the interval size for the MPS, then exchange
       * the two symbols for coding efficiency, otherwise code the LPS
       * as usual: */
      e->c += e->a;
      e->a = qe;
    }
    *st = (sv & 0x80) ^ nl;	/* Estimate_after_LPS */
  } else {
    /* Encode the more probable symbol */
    if (e->a >= 0x8000L)
      return;  /* A >= 0x8000 -> ready, no renormalization required */
    if (e->a < qe) {
      /* If the interval size (qe) for the less probable symbol (LPS)
       * is larger than the interval size for the MPS, then exchange
       * the two symbols for coding efficiency: */
      e->c += e->a;
      e->a = qe;
    }
    *st = (sv & 0x80) ^ nm;	/* Estimate_after_MPS */
  }

  /* Renormalization & data output per section D.1.6 */
  do {
    e->a <<= 1;
    e->c <<= 1;
    if (--e->ct == 0) {
      /* Another byte is ready for output */
      temp = e->c >> 19;
      if (temp > 0xFF) {
	/* Handle overflow over all stacked 0xFF bytes */
	if (e->buffer >= 0) {
	  if (e->zc)
	    do emit_byte(0x00, cinfo);
	    while (--e->zc);
	  emit_byte(e->buffer + 1, cinfo);
	  if (e->buffer + 1 == 0xFF)
	    emit_byte(0x00, cinfo);
	}
	e->zc += e->sc;  /* carry-over converts stacked 0xFF bytes to 0x00 */
	e->sc = 0;
	/* Note: The 3 spacer bits in the C register guarantee
	 * that the new buffer byte can't be 0xFF here
	 * (see page 160 in the P&M JPEG book). */
	e->buffer = temp & 0xFF;  /* new output byte, might overflow later */
      } else if (temp == 0xFF) {
	++e->sc;  /* stack 0xFF byte (which might overflow later) */
      } else {
	/* Output all stacked 0xFF bytes, they will not overflow any more */
	if (e->buffer == 0)
	  ++e->zc;
	else if (e->buffer >= 0) {
	  if (e->zc)
	    do emit_byte(0x00, cinfo);
	    while (--e->zc);
	  emit_byte(e->buffer, cinfo);
	}
	if (e->sc) {
	  if (e->zc)
	    do emit_byte(0x00, cinfo);
	    while (--e->zc);
	  do {
	    emit_byte(0xFF, cinfo);
	    emit_byte(0x00, cinfo);
	  } while (--e->sc);
	}
	e->buffer = temp & 0xFF;  /* new output byte (can still overflow) */
      }
      e->c &= 0x7FFFFL;
      e->ct += 8;
    }
  } while (e->a < 0x8000L);
}